

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O2

_Bool test_clear(void)

{
  int n_row;
  int iVar1;
  ulong uVar2;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  uint N;
  uint8_t *m;
  long lVar3;
  undefined1 auStack_68 [8];
  undefined1 local_60 [8];
  m256v A;
  
  A.e = auStack_68;
  for (uVar2 = 0; uVar2 != 6; uVar2 = uVar2 + 1) {
    n_row = (&DAT_00104690)[uVar2];
    lVar3 = 0;
    while (lVar3 != 0x18) {
      iVar1 = *(int *)((long)&DAT_001046b0 + lVar3);
      N = iVar1 * n_row;
      m = A.e + -((ulong)N + 0xf & 0xfffffffffffffff0);
      m[-8] = 0xc6;
      m[-7] = '\x1b';
      m[-6] = '\x10';
      m[-5] = '\0';
      m[-4] = '\0';
      m[-3] = '\0';
      m[-2] = '\0';
      m[-1] = '\0';
      rand_coeffs(m,N,(uint8_t)in_RDX);
      m[-8] = 0xda;
      m[-7] = '\x1b';
      m[-6] = '\x10';
      m[-5] = '\0';
      m[-4] = '\0';
      m[-3] = '\0';
      m[-2] = '\0';
      m[-1] = '\0';
      m256v_make((m256v *)local_60,n_row,iVar1,m);
      m[-8] = 0xe2;
      m[-7] = '\x1b';
      m[-6] = '\x10';
      m[-5] = '\0';
      m[-4] = '\0';
      m[-3] = '\0';
      m[-2] = '\0';
      m[-1] = '\0';
      m256v_clear((m256v *)local_60);
      m[-8] = 0xea;
      m[-7] = '\x1b';
      m[-6] = '\x10';
      m[-5] = '\0';
      m[-4] = '\0';
      m[-3] = '\0';
      m[-2] = '\0';
      m[-1] = '\0';
      iVar1 = m256v_iszero((m256v *)local_60);
      lVar3 = lVar3 + 4;
      in_RDX = extraout_RDX;
      if (iVar1 == 0) goto LAB_00101c04;
    }
  }
LAB_00101c04:
  return 5 < uVar2;
}

Assistant:

static bool test_clear()
{
	const int nrow[] = { 1, 2, 3, 5, 9, 10 };
	const int ncol[] = { 1, 2, 3, 7, 8, 10 };
	for (int ir = 0; ir < array_size(nrow); ++ir) {
		const int nr = nrow[ir];
		for (int ic = 0; ic < array_size(ncol); ++ic) {
			const int nc = ncol[ic];

			/* Create a random matrix, clear it, and verify
			 * it's cleared
			 */
			Def_mat256_rand(A, a, nr, nc, 0xff)
			m256v_clear(&A);
			if (!m256v_iszero(&A))
				return false;
		}
	}

	return true;
}